

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::declaration(Parser *this)

{
  Node *operand1;
  Node *this_00;
  string local_58;
  string local_38;
  
  Lexer::next_token(this->lex);
  eat_abi_cxx11_(&local_38,this,MUT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  Lexer::next_token(this->lex);
  operand1 = set(this);
  this_00 = (Node *)operator_new(0x48);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  Node::Node(this_00,DCLRT,operand1,(Node *)0x0,&local_58,(Node *)0x0,(Node *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return this_00;
}

Assistant:

Node* Parser::declaration() // ������� ������� ����������
{
	lex->next_token();
	eat(token_type::MUT);
	lex->next_token();

	Node* set_node = set();

	Node* declaration_node = new Node(node_type::DCLRT, set_node);
	return declaration_node;
}